

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall position::setup(position *this,istringstream *fen)

{
  Color *c_00;
  U64 *pUVar1;
  U16 *pUVar2;
  byte bVar3;
  Color us;
  bool bVar4;
  undefined2 uVar5;
  U16 UVar6;
  uint uVar7;
  U64 UVar8;
  mapped_type *pmVar9;
  Square SVar10;
  int iVar11;
  char *c;
  _Alloc_hider _Var12;
  Square *s_00;
  size_type sVar13;
  Color us_00;
  Color stm;
  Square s;
  istringstream *local_60;
  string token;
  Color local_34;
  
  clear(this);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  local_60 = fen;
  std::operator>>((istream *)fen,(string *)&token);
  s = A8;
  _Var12._M_p = token._M_dataplus._M_p;
  for (sVar13 = token._M_string_length; sVar13 != 0; sVar13 = sVar13 - 1) {
    uVar7 = (int)*_Var12._M_p - 0x30;
    if (uVar7 < 10) {
      s = s + uVar7;
    }
    else if (*_Var12._M_p == '/') {
      s = s - A3;
    }
    else {
      set_piece(this,_Var12._M_p,&s);
      s = s + B1;
    }
    _Var12._M_p = _Var12._M_p + 1;
  }
  std::operator>>((istream *)local_60,(string *)&token);
  bVar4 = std::operator==(&token,"w");
  c_00 = &(this->ifo).stm;
  (this->ifo).stm = (uint)!bVar4;
  UVar8 = zobrist::stm(c_00);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar8;
  UVar8 = zobrist::stm(c_00);
  pUVar1 = &(this->ifo).repkey;
  *pUVar1 = *pUVar1 ^ UVar8;
  std::operator>>((istream *)local_60,(string *)&token);
  (this->ifo).cmask = 0;
  _Var12 = token._M_dataplus;
  for (sVar13 = token._M_string_length; sVar13 != 0; sVar13 = sVar13 - 1) {
    pmVar9 = std::
             map<char,_unsigned_short,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_short>_>_>
             ::at(&CastleRights,_Var12._M_p);
    stm = CONCAT22(stm._2_2_,*pmVar9);
    pUVar2 = &(this->ifo).cmask;
    *pUVar2 = *pUVar2 | *pmVar9;
    UVar8 = zobrist::castle(c_00,(U16 *)&stm);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar8;
    UVar8 = zobrist::castle(c_00,(U16 *)&stm);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar8;
    _Var12._M_p = _Var12._M_p + 1;
  }
  std::operator>>((istream *)local_60,(string *)&token);
  (this->ifo).eps = no_square;
  iVar11 = 9;
  uVar7 = 9;
  for (sVar13 = 0; token._M_string_length != sVar13; sVar13 = sVar13 + 1) {
    bVar3 = token._M_dataplus._M_p[sVar13];
    if ((byte)(bVar3 + 0x9f) < 8) {
      uVar7 = (uint)(byte)(bVar3 + 0x9f);
    }
    if ((bVar3 == 0x36) || (bVar3 == 0x33)) {
      iVar11 = bVar3 - 0x31;
    }
  }
  SVar10 = uVar7 + iVar11 * 8;
  (this->ifo).eps = SVar10;
  if (SVar10 < squares) {
    stm = CONCAT31(stm._1_3_,(char)uVar7) & 0xffffff07;
    UVar8 = zobrist::ep((U8 *)&stm);
    pUVar1 = &(this->ifo).key;
    *pUVar1 = *pUVar1 ^ UVar8;
    stm = CONCAT31(stm._1_3_,(char)(this->ifo).eps) & 0xffffff07;
    UVar8 = zobrist::ep((U8 *)&stm);
    pUVar1 = &(this->ifo).repkey;
    *pUVar1 = *pUVar1 ^ UVar8;
  }
  else {
    (this->ifo).eps = no_square;
  }
  std::operator>>((istream *)local_60,(string *)&token);
  bVar4 = std::operator==(&token,"-");
  if (bVar4) {
    uVar5 = 0;
  }
  else {
    iVar11 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
    uVar5 = (undefined2)iVar11;
  }
  (this->ifo).move50 = (U8)uVar5;
  stm = CONCAT22(stm._2_2_,uVar5) & 0xffff00ff;
  UVar8 = zobrist::mv50((U16 *)&stm);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar8;
  std::operator>>((istream *)local_60,(string *)&token);
  bVar4 = std::operator==(&token,"-");
  if (bVar4) {
    UVar6 = 0;
  }
  else {
    iVar11 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
    UVar6 = (U16)iVar11;
  }
  (this->ifo).hmvs = UVar6;
  UVar8 = zobrist::hmvs(&(this->ifo).hmvs);
  pUVar1 = &(this->ifo).key;
  *pUVar1 = *pUVar1 ^ UVar8;
  us = (this->ifo).stm;
  s_00 = (this->ifo).ks + us;
  *s_00 = (this->pcs).king_sq._M_elems[us];
  us_00 = (Color)((long)(int)us ^ 1U);
  stm = us;
  local_34 = us_00;
  bVar4 = is_attacked(this,s_00,&stm,&local_34,0);
  (this->ifo).incheck = bVar4;
  if (bVar4) {
    local_34 = us_00;
    UVar8 = attackers_of2(this,s_00,&local_34);
  }
  else {
    UVar8 = 0;
  }
  (this->ifo).checkers = UVar8;
  UVar8 = pinned(this,us);
  (this->ifo).pinned[us] = UVar8;
  UVar8 = pinned(this,us_00);
  (this->ifo).pinned[(long)(int)us ^ 1U] = UVar8;
  std::__cxx11::string::~string((string *)&token);
  return;
}

Assistant:

void position::setup(std::istringstream& fen) {
	clear();

	std::string token;
	fen >> token;
	Square s = Square::A8;

	for (auto& c : token) {
		if (isdigit(c)) s += int(c - '0');
		else if (c == '/') s -= 16;
		else { set_piece(c, s); ++s; }
	}

	// side to move
	fen >> token;
	ifo.stm = (token == "w" ? Color::white : Color::black);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	// the castle rights
	fen >> token;
	ifo.cmask = U16(0);
	for (auto& c : token) {
		U16 cr = CastleRights.at(c);
		ifo.cmask |= cr;
		ifo.key ^= zobrist::castle(ifo.stm, cr);
		ifo.repkey ^= zobrist::castle(ifo.stm, cr);
	}


	// ep square
	fen >> token;
	ifo.eps = Square::no_square;
	Row row = Row::no_row; Col col = Col::no_col;
	for (auto& c : token) {
		if (c >= 'a' && c <= 'h') col = Col(c - 'a');
		if (c == '3' || c == '6') row = Row(c - '1');
	}
	ifo.eps = Square(8 * row + col);

	if (!util::on_board(ifo.eps)) ifo.eps = Square::no_square;

	if (ifo.eps != Square::no_square) {
		ifo.key ^= zobrist::ep(util::col(ifo.eps));
		ifo.repkey ^= zobrist::ep(util::col(ifo.eps));
	}

	// half-moves since last pawn move/capture
	fen >> token;

	ifo.move50 = (token != "-" ? U8(std::stoi(token)) : 0);

	ifo.key ^= zobrist::mv50(ifo.move50);

	// move counter
	fen >> token;
	ifo.hmvs = (token != "-" ? U16(std::stoi(token)) : 0);
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// check info
	Color stm = to_move();
	ifo.ks[stm] = pcs.king_sq[stm];
	ifo.incheck = is_attacked(ifo.ks[stm], stm, Color(stm ^ 1));

	ifo.checkers = (in_check() ? attackers_of2(ifo.ks[stm], Color(stm ^ 1)) : 0ULL);
	ifo.pinned[stm] = pinned(stm);
	ifo.pinned[stm ^ 1] = pinned(Color(stm ^ 1));
}